

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfEnvmap.cpp
# Opt level: O0

V2f Imf_2_5::LatLongMap::latLong(V3f *dir)

{
  int iVar1;
  float *in_RSI;
  Vec2<float> *in_RDI;
  Vec2<float> *pVVar2;
  float extraout_XMM0_Da;
  float fVar3;
  float fVar4;
  double dVar5;
  V2f extraout_XMM0_Qa;
  float longitude;
  float latitude;
  float r;
  float local_44;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  pVVar2 = in_RDI;
  dVar5 = std::sqrt((double)(ulong)(uint)(in_RSI[2] * in_RSI[2] + *in_RSI * *in_RSI));
  std::abs((int)pVVar2);
  if (extraout_XMM0_Da <= SUB84(dVar5,0)) {
    fVar3 = in_RSI[1];
    fVar4 = Imath_2_5::Vec3<float>::length
                      ((Vec3<float> *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8))
    ;
    dVar5 = std::asin((double)(ulong)(uint)(fVar3 / fVar4));
    fVar3 = SUB84(dVar5,0);
  }
  else {
    fVar3 = Imath_2_5::Vec3<float>::length
                      ((Vec3<float> *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8))
    ;
    dVar5 = std::acos((double)(ulong)(uint)(SUB84(dVar5,0) / fVar3));
    fVar3 = SUB84(dVar5,0);
    iVar1 = Imath_2_5::sign<float>(in_RSI[1]);
    fVar3 = fVar3 * (float)iVar1;
  }
  if ((((in_RSI[2] != 0.0) || (NAN(in_RSI[2]))) || (*in_RSI != 0.0)) || (NAN(*in_RSI))) {
    dVar5 = std::atan2((double)(ulong)(uint)*in_RSI,(double)(ulong)(uint)in_RSI[2]);
    local_44 = SUB84(dVar5,0);
  }
  else {
    local_44 = 0.0;
  }
  Imath_2_5::Vec2<float>::Vec2(in_RDI,fVar3,local_44);
  return extraout_XMM0_Qa;
}

Assistant:

V2f	
latLong (const V3f &dir)
{
    float r = sqrt (dir.z * dir.z + dir.x * dir.x);

    float latitude = (r < abs (dir.y))?
			 acos (r / dir.length()) * sign (dir.y):
			 asin (dir.y / dir.length());

    float longitude = (dir.z == 0 && dir.x == 0)? 0: atan2 (dir.x, dir.z);

    return V2f (latitude, longitude);
}